

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O0

Status __thiscall
sentencepiece::SentencePieceProcessor::NBestEncode
          (SentencePieceProcessor *this,string_view input,int nbest_size,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *pieces)

{
  bool bVar1;
  StatusBuilder *pSVar2;
  RepeatedPtrField<sentencepiece::SentencePieceText> *this_00;
  RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *this_01;
  reference this_02;
  string *__args;
  undefined4 in_register_0000000c;
  long *plVar3;
  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *in_R9;
  SentencePieceText_SentencePiece *sp;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  SentencePieceText *nbest;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<sentencepiece::SentencePieceText> *__range1;
  undefined1 local_208 [8];
  NBestSentencePieceText spt;
  StatusBuilder local_1d0;
  uint local_50;
  byte local_39;
  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *local_38;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pieces_local;
  long *plStack_28;
  int nbest_size_local;
  SentencePieceProcessor *this_local;
  string_view input_local;
  Status *_status;
  
  input_local._M_len = CONCAT44(in_register_0000000c,nbest_size);
  this_local = (SentencePieceProcessor *)input._M_str;
  plVar3 = (long *)input._M_len;
  pieces_local._4_4_ = SUB84(pieces,0);
  local_39 = 0;
  local_38 = in_R9;
  plStack_28 = plVar3;
  input_local._M_str = (char *)this;
  (**(code **)(*plVar3 + 0x38))(this);
  bVar1 = util::Status::ok((Status *)this);
  if (!bVar1) {
    local_39 = 1;
  }
  local_50 = (uint)!bVar1;
  if ((local_39 & 1) == 0) {
    util::Status::~Status((Status *)this);
  }
  if (local_50 == 0) {
    if (local_38 ==
        (vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
         *)0x0) {
      util::StatusBuilder::StatusBuilder(&local_1d0,kInternal);
      pSVar2 = util::StatusBuilder::operator<<
                         (&local_1d0,(char (*) [31])"src/sentencepiece_processor.cc");
      pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [2])0x339e65);
      spt._44_4_ = 0x1b4;
      pSVar2 = util::StatusBuilder::operator<<(pSVar2,(int *)&spt.field_0x2c);
      pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [4])") [");
      pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [7])"pieces");
      pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [3])"] ");
      util::StatusBuilder::operator<<(pSVar2,(char (*) [25])"output container is null");
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
      util::StatusBuilder::~StatusBuilder(&local_1d0);
    }
    else {
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::clear((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)local_38);
      NBestSentencePieceText::NBestSentencePieceText((NBestSentencePieceText *)local_208);
      (**(code **)(*plVar3 + 0xd0))
                (this,plVar3,this_local,input_local._M_len,pieces_local._4_4_,local_208);
      bVar1 = util::Status::ok((Status *)this);
      local_50 = (uint)!bVar1;
      if (bVar1) {
        util::Status::~Status((Status *)this);
      }
      if (local_50 == 0) {
        this_00 = NBestSentencePieceText::nbests((NBestSentencePieceText *)local_208);
        __end1 = google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText>::begin
                           (this_00);
        nbest = (SentencePieceText *)
                google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText>::end(this_00);
        while (bVar1 = google::protobuf::internal::
                       RepeatedPtrIterator<const_sentencepiece::SentencePieceText>::operator!=
                                 (&__end1,(iterator *)&nbest), bVar1) {
          result.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)google::protobuf::internal::
                        RepeatedPtrIterator<const_sentencepiece::SentencePieceText>::operator*
                                  (&__end1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
          this_01 = SentencePieceText::pieces
                              ((SentencePieceText *)
                               result.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __end2 = google::protobuf::
                   RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::begin(this_01);
          sp = (SentencePieceText_SentencePiece *)
               google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::
               end(this_01);
          while (bVar1 = google::protobuf::internal::
                         RepeatedPtrIterator<const_sentencepiece::SentencePieceText_SentencePiece>::
                         operator!=(&__end2,(iterator *)&sp), bVar1) {
            this_02 = google::protobuf::internal::
                      RepeatedPtrIterator<const_sentencepiece::SentencePieceText_SentencePiece>::
                      operator*(&__end2);
            __args = SentencePieceText_SentencePiece::piece_abi_cxx11_(this_02);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &__range2,__args);
            google::protobuf::internal::
            RepeatedPtrIterator<const_sentencepiece::SentencePieceText_SentencePiece>::operator++
                      (&__end2);
          }
          std::
          vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    (local_38,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&__range2);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
          google::protobuf::internal::RepeatedPtrIterator<const_sentencepiece::SentencePieceText>::
          operator++(&__end1);
        }
        util::OkStatus();
        local_50 = 1;
      }
      NBestSentencePieceText::~NBestSentencePieceText((NBestSentencePieceText *)local_208);
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::NBestEncode(
    absl::string_view input, int nbest_size,
    std::vector<std::vector<std::string>> *pieces) const {
  CHECK_OR_RETURN_STATUS_STL(pieces);

  NBestSentencePieceText spt;
  RETURN_IF_ERROR(NBestEncode(input, nbest_size, &spt));
  for (const auto &nbest : spt.nbests()) {
    std::vector<std::string> result;
    for (const auto &sp : nbest.pieces()) {
      result.emplace_back(sp.piece());
    }
    pieces->emplace_back(result);
  }

  return util::OkStatus();
}